

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O2

void mbedtls_aesni_inverse_key(uchar *invkey,uchar *fwdkey,int nr)

{
  undefined8 uVar1;
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  uchar *ik;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  
  pauVar2 = (undefined1 (*) [16])(fwdkey + (nr << 4));
  uVar1 = *(undefined8 *)(*pauVar2 + 8);
  *(undefined8 *)invkey = *(undefined8 *)*pauVar2;
  *(undefined8 *)(invkey + 8) = uVar1;
  pauVar4 = (undefined1 (*) [16])(invkey + 0x10);
  while (pauVar3 = pauVar2 + -1, fwdkey < pauVar3) {
    auVar5 = aesimc(*pauVar3);
    *pauVar4 = auVar5;
    pauVar4 = pauVar4 + 1;
    pauVar2 = pauVar3;
  }
  uVar1 = *(undefined8 *)(pauVar2[-1] + 8);
  *(undefined8 *)*pauVar4 = *(undefined8 *)*pauVar3;
  *(undefined8 *)(*pauVar4 + 8) = uVar1;
  return;
}

Assistant:

void mbedtls_aesni_inverse_key( unsigned char *invkey,
                        const unsigned char *fwdkey, int nr )
{
    unsigned char *ik = invkey;
    const unsigned char *fk = fwdkey + 16 * nr;

    memcpy( ik, fk, 16 );

    for( fk -= 16, ik += 16; fk > fwdkey; fk -= 16, ik += 16 )
        asm( "movdqu (%0), %%xmm0       \n\t"
             AESIMC  xmm0_xmm0         "\n\t"
             "movdqu %%xmm0, (%1)       \n\t"
             :
             : "r" (fk), "r" (ik)
             : "memory", "xmm0" );

    memcpy( ik, fk, 16 );
}